

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_mapper.hpp
# Opt level: O0

shared_ptr<unsigned_char> __thiscall
pstore::in_memory_mapper::pointer(in_memory_mapper *this,in_memory *file,uint64_t offset)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<unsigned_char> sVar2;
  undefined1 local_40 [24];
  shared_ptr<unsigned_char> p;
  uint64_t offset_local;
  in_memory *file_local;
  
  p.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)offset;
  pstore::file::in_memory::data((in_memory *)local_40);
  std::static_pointer_cast<unsigned_char,void>((shared_ptr<void> *)(local_40 + 0x10));
  std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)local_40);
  peVar1 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)(local_40 + 0x10));
  std::shared_ptr<unsigned_char>::shared_ptr<unsigned_char>
            ((shared_ptr<unsigned_char> *)this,(shared_ptr<unsigned_char> *)(local_40 + 0x10),
             peVar1 + (long)p.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi);
  std::shared_ptr<unsigned_char>::~shared_ptr((shared_ptr<unsigned_char> *)(local_40 + 0x10));
  sVar2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<unsigned_char>)
         sVar2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<std::uint8_t> pointer (pstore::file::in_memory & file,
                                                      std::uint64_t const offset) {
            auto const p = std::static_pointer_cast<std::uint8_t> (file.data ());
            return std::shared_ptr<std::uint8_t> (p, p.get () + offset);
        }